

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O2

int Dau_DsdMinBase(word *pTruth,int nVars,int *pVarsNew)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  uint iVar;
  
  uVar2 = 0;
  uVar4 = 0;
  if (0 < nVars) {
    uVar4 = (ulong)(uint)nVars;
  }
  for (; uVar3 = nVars, uVar4 != uVar2; uVar2 = uVar2 + 1) {
    pVarsNew[uVar2] = (int)uVar2;
  }
  while (0 < (int)uVar3) {
    iVar = uVar3 - 1;
    iVar1 = Abc_TtHasVar(pTruth,nVars,uVar3 - 1);
    uVar3 = iVar;
    if (iVar1 == 0) {
      Abc_TtSwapVars(pTruth,nVars,iVar,nVars + -1);
      pVarsNew[iVar] = pVarsNew[(long)nVars + -1];
      nVars = nVars + -1;
    }
  }
  return nVars;
}

Assistant:

int Dau_DsdMinBase( word * pTruth, int nVars, int * pVarsNew )
{
    int v;
    for ( v = 0; v < nVars; v++ )
        pVarsNew[v] = v;
    for ( v = nVars - 1; v >= 0; v-- )
    {
        if ( Abc_TtHasVar( pTruth, nVars, v ) )
            continue;
        Abc_TtSwapVars( pTruth, nVars, v, nVars-1 );
        pVarsNew[v] = pVarsNew[--nVars];
    }
    return nVars;
}